

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O3

void __thiscall
antlr::RecognitionException::RecognitionException
          (RecognitionException *this,string *s,string *fileName_,int line_,int column_)

{
  pointer pcVar1;
  
  (this->super_ANTLRException)._vptr_ANTLRException = (_func_int **)&PTR__ANTLRException_002f6360;
  (this->super_ANTLRException).text._M_dataplus._M_p =
       (pointer)&(this->super_ANTLRException).text.field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ANTLRException).text,pcVar1,pcVar1 + s->_M_string_length);
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_002f7748;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  pcVar1 = (fileName_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->fileName,pcVar1,pcVar1 + fileName_->_M_string_length);
  this->line = line_;
  this->column = column_;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s,
                                           const ANTLR_USE_NAMESPACE(std)string& fileName_,
                                           int line_,int column_)
: ANTLRException(s)
, fileName(fileName_)
, line(line_)
, column(column_)
{
}